

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<float,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  float fVar1;
  pointer pVVar2;
  pointer pVVar3;
  Variable<tcu::Vector<float,_3>_> *pVVar4;
  pointer pcVar5;
  Variable<float> *pVVar6;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar7;
  bool bVar8;
  ContextType type;
  int iVar9;
  uint uVar10;
  undefined8 uVar11;
  char *__s;
  size_t sVar12;
  long *plVar13;
  ShaderExecutor *pSVar14;
  long lVar15;
  IVal *pIVar16;
  IVal *x;
  ulong uVar17;
  TestError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  long lVar19;
  Vector<float,_3> *pVVar20;
  IVal IVar21;
  MessageBuilder *pMVar22;
  long lVar23;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pIVar24;
  byte bVar25;
  double dVar26;
  double dVar27;
  IVal reference1;
  FuncSet funcs;
  IVal in2;
  IVal in3;
  ostringstream os;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  FloatFormat highpFmt;
  ShaderSpec spec;
  ostringstream oss;
  undefined1 auStack_4f8 [8];
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4f0;
  IVal local_4e1;
  undefined1 local_4e0 [8];
  undefined8 local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4d0;
  _Rb_tree_node_base *local_4c0;
  size_t local_4b8;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4b0;
  FloatFormat *local_4a8;
  size_t local_4a0;
  Statement *local_498;
  string local_490;
  ulong local_470;
  IVal local_468;
  ulong local_450;
  undefined1 local_448 [8];
  pointer pVStack_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  double local_428;
  Data local_420;
  undefined4 local_410;
  ios_base local_3d8 [8];
  ios_base local_3d0 [272];
  PrecisionCase *local_2c0;
  ulong local_2b8;
  ResultCollector *local_2b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2a8;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_278;
  FloatFormat local_248;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  bVar25 = 0;
  pVVar2 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_4a0 = ((long)pVVar3 - (long)pVVar2 >> 2) * -0x5555555555555555;
  local_4f0 = variables;
  local_4b0 = inputs;
  local_498 = stmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_278,local_4a0);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_248.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_248.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_248.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_248.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_248.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_248.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_248.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_248.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_248._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2a8._M_impl.super__Rb_tree_header._M_header;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_448 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_440);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_440,"Statement: ",0xb);
  (*local_498->_vptr_Statement[2])(local_498,(ostringstream *)&pVStack_440);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_440);
  std::ios_base::~ios_base(local_3d0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_4d8 = (double)((ulong)local_4d8._4_4_ << 0x20);
  aStack_4d0._M_allocated_capacity = 0;
  local_4b8 = 0;
  aStack_4d0._8_8_ = (_Rb_tree_node_base *)&local_4d8;
  local_4c0 = (_Rb_tree_node_base *)&local_4d8;
  (*local_498->_vptr_Statement[4])(local_498,local_4e0);
  if ((_Rb_tree_node_base *)aStack_4d0._8_8_ != (_Rb_tree_node_base *)&local_4d8) {
    uVar11 = aStack_4d0._8_8_;
    do {
      (**(code **)(**(long **)(uVar11 + 0x20) + 0x30))(*(long **)(uVar11 + 0x20),local_1a8);
      uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11);
    } while ((_Rb_tree_node_base *)uVar11 != (_Rb_tree_node_base *)&local_4d8);
  }
  if (local_4b8 != 0) {
    local_448 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_440);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_440,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_440,local_490._M_dataplus._M_p,local_490._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_440);
    std::ios_base::~ios_base(local_3d0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_4e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,"precision ",10);
  __s = glu::getPrecisionName((this->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_4f8 + *(long *)((long)local_448 + -0x18)) + 0xb0);
  }
  else {
    sVar12 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,__s,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_448);
  std::ios_base::~ios_base(local_3d8);
  type.super_ApiType.m_bits = (ApiType)(*((this->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((this->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&this->m_extension);
    plVar13 = (long *)std::__cxx11::string::append(local_1a8);
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 == paVar18) {
      local_438._M_allocated_capacity = paVar18->_M_allocated_capacity;
      local_438._8_8_ = plVar13[3];
      local_448 = (undefined1  [8])&local_438;
    }
    else {
      local_438._M_allocated_capacity = paVar18->_M_allocated_capacity;
      local_448 = (undefined1  [8])*plVar13;
    }
    pVStack_440 = (pointer)plVar13[1];
    *plVar13 = (long)paVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_448);
    if (local_448 != (undefined1  [8])&local_438) {
      operator_delete((void *)local_448,local_438._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),2);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_448,this,
             (local_4f0->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar11 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)(local_220._8_8_ + 0x38),(string *)local_448);
  glu::VarType::operator=(&((pointer)(uVar11 + 0x38))->varType,(VarType *)&local_428);
  glu::VarType::~VarType((VarType *)&local_428);
  if (local_448 != (undefined1  [8])&local_438) {
    operator_delete((void *)local_448,local_438._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_448,this,
             (local_4f0->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar11 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_448);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_428);
  glu::VarType::~VarType((VarType *)&local_428);
  if (local_448 != (undefined1  [8])&local_438) {
    operator_delete((void *)local_448,local_438._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),1);
  makeSymbol<float>((Symbol *)local_448,this,
                    (local_4f0->out0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar11 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_448);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_428);
  glu::VarType::~VarType((VarType *)&local_428);
  if (local_448 != (undefined1  [8])&local_438) {
    operator_delete((void *)local_448,local_438._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
  (*local_498->_vptr_Statement[2])(local_498,local_448);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_448);
  std::ios_base::~ios_base(local_3d8);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  pSVar14 = ShaderExecUtil::createExecutor
                      ((this->m_ctx).renderContext,(this->m_ctx).shaderType,(ShaderSpec *)local_220)
  ;
  local_448 = (undefined1  [8])
              (local_4b0->in0).
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  pVStack_440 = (local_4b0->in1).
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_438._M_allocated_capacity =
       (size_type)
       (local_4b0->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_438._8_8_ =
       (local_4b0->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_278.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar14->_vptr_ShaderExecutor[3])
            (pSVar14,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar9 = (*pSVar14->_vptr_ShaderExecutor[2])(pSVar14);
  if ((char)iVar9 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar14->_vptr_ShaderExecutor[5])(pSVar14);
  (*pSVar14->_vptr_ShaderExecutor[6])(pSVar14,local_4a0,local_448,local_1a8);
  local_4a8 = &(this->m_ctx).floatFormat;
  (*pSVar14->_vptr_ShaderExecutor[1])(pSVar14);
  pVVar7 = local_4f0;
  lVar15 = 8;
  do {
    *(undefined1 *)((long)&local_450 + lVar15) = 0;
    *(undefined8 *)(local_448 + lVar15) = 0x7ff0000000000000;
    *(undefined8 *)((long)&pVStack_440 + lVar15) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x50);
  lVar15 = 8;
  do {
    *(undefined1 *)((long)&local_450 + lVar15) = 0;
    *(undefined8 *)(local_448 + lVar15) = 0x7ff0000000000000;
    *(undefined8 *)((long)&pVStack_440 + lVar15) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x50);
  lVar15 = 8;
  do {
    local_1a8[lVar15 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar15) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar15 + 8) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x50);
  lVar15 = 8;
  do {
    local_1a8[lVar15 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar15) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar15 + 8) = 0xfff0000000000000;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x50);
  local_4e0 = (undefined1  [8])((ulong)local_4e0 & 0xffffffffffffff00);
  local_4d8 = INFINITY;
  aStack_4d0._M_allocated_capacity = 0xfff0000000000000;
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_2a8,
             (local_4f0->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_448);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_2a8,
             (pVVar7->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2a8,
             (pVVar7->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_490);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2a8,
             (pVVar7->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_468);
  Environment::bind<float>
            ((Environment *)&local_2a8,
             (pVVar7->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
             (IVal *)local_4e0);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2a8,
             (pVVar7->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_4e1);
  if (pVVar3 == pVVar2) {
LAB_007c0b7a:
    local_448 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_440);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_440,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_440);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_440," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_2b0 = &this->m_status;
    local_2b8 = local_4a0 + (local_4a0 == 0);
    lVar23 = 0;
    lVar15 = 0;
    uVar17 = 0;
    local_470 = 0;
    pIVar24 = local_4b0;
    local_2c0 = this;
    do {
      local_468._0_8_ = local_468._0_8_ & 0xffffffffffffff00;
      local_468.m_lo = INFINITY;
      local_468.m_hi = -INFINITY;
      local_450 = uVar17;
      if ((uVar17 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((this->super_TestCase).super_TestNode.m_testCtx);
      }
      pVVar2 = (pIVar24->in0).
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_4e0 = *(undefined1 (*) [8])((long)pVVar2->m_data + lVar15);
      local_4d8._0_4_ = *(float *)((long)pVVar2->m_data + lVar15 + 8);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_1a8,local_4a8,(Vector<float,_3> *)local_4e0);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_448,local_4a8,(IVal *)local_1a8);
      pIVar16 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_2a8,
                           (local_4f0->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      pMVar22 = (MessageBuilder *)local_448;
      for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
        *(TestLog **)pIVar16->m_data = pMVar22->m_log;
        pMVar22 = (MessageBuilder *)((long)pMVar22 + (ulong)bVar25 * -0x10 + 8);
        pIVar16 = (IVal *)((long)pIVar16 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      pVVar2 = (pIVar24->in1).
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_4d8 = (double)CONCAT44(local_4d8._4_4_,
                                   *(undefined4 *)((long)pVVar2->m_data + lVar15 + 8));
      local_4e0 = *(undefined1 (*) [8])((long)pVVar2->m_data + lVar15);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_1a8,local_4a8,(Vector<float,_3> *)local_4e0);
      pVVar7 = local_4f0;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_448,local_4a8,(IVal *)local_1a8);
      pIVar16 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_2a8,
                           (pVVar7->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      pMVar22 = (MessageBuilder *)local_448;
      for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
        *(TestLog **)pIVar16->m_data = pMVar22->m_log;
        pMVar22 = (MessageBuilder *)((long)pMVar22 + (ulong)bVar25 * -0x10 + 8);
        pIVar16 = (IVal *)((long)pIVar16 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2a8,
                 (pVVar7->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2a8,
                 (pVVar7->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_420.basic.type = (this->m_ctx).precision;
      local_428 = local_4a8->m_maxValue;
      local_448 = *(undefined1 (*) [8])local_4a8;
      pVStack_440 = *(pointer *)&local_4a8->m_fractionBits;
      local_438._M_allocated_capacity = *(undefined8 *)&local_4a8->m_hasInf;
      local_438._8_8_ = *(undefined8 *)&local_4a8->m_exactPrecision;
      local_410 = 0;
      local_420._8_8_ = &local_2a8;
      (*local_498->_vptr_Statement[3])(local_498,(MessageBuilder *)local_448);
      x = Environment::lookup<float>
                    ((Environment *)&local_2a8,
                     (pVVar7->out0).
                     super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr
                    );
      tcu::FloatFormat::convert((Interval *)local_448,&local_248,x);
      local_468.m_hi = (double)local_438._M_allocated_capacity;
      local_468._0_8_ = local_448;
      uVar11 = local_468._0_8_;
      local_468.m_lo = (double)pVStack_440;
      fVar1 = local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[local_450];
      dVar26 = (double)fVar1;
      dVar27 = dVar26;
      if (NAN(fVar1)) {
        dVar27 = INFINITY;
        dVar26 = -INFINITY;
      }
      IVar21 = (IVal)(dVar26 <= (double)local_438._M_allocated_capacity &&
                     (double)pVStack_440 <= dVar27);
      if ((NAN(fVar1)) &&
         (dVar26 <= (double)local_438._M_allocated_capacity && (double)pVStack_440 <= dVar27)) {
        local_468.m_hasNaN = local_448[0];
        IVar21 = (IVal)local_468.m_hasNaN;
      }
      local_448 = (undefined1  [8])&local_438;
      local_468._0_8_ = uVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_448,"Shader output 0 is outside acceptable range","");
      bVar8 = tcu::ResultCollector::check(local_2b0,(bool)((byte)IVar21 & 1),(string *)local_448);
      if (local_448 != (undefined1  [8])&local_438) {
        operator_delete((void *)local_448,(ulong)(local_438._M_allocated_capacity + 1));
      }
      pIVar24 = local_4b0;
      if ((!bVar8) && (uVar10 = (int)local_470 + 1, local_470 = (ulong)uVar10, (int)uVar10 < 0x65))
      {
        local_448 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_440);
        pIVar24 = local_4b0;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_440,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_440," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_440,"\t",1);
        pVVar4 = (local_4f0->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                 .m_ptr;
        pVVar20 = (Vector<float,_3> *)(local_1a8 + 0x10);
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        local_1a8._0_8_ = pVVar20;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_440,(char *)local_1a8._0_8_,local_1a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_440," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_4e0,(BuiltinPrecisionTests *)&local_248,
                   (FloatFormat *)
                   ((long)((pIVar24->in0).
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15),pVVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_440,(char *)local_4e0,(long)local_4d8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_440,"\n",1);
        if (local_4e0 != (undefined1  [8])&aStack_4d0) {
          operator_delete((void *)local_4e0,(ulong)(aStack_4d0._M_allocated_capacity + 1));
        }
        if ((Vector<float,_3> *)local_1a8._0_8_ != (Vector<float,_3> *)(local_1a8 + 0x10)) {
          operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_440,"\t",1);
        pVVar4 = (local_4f0->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                 .m_ptr;
        pVVar20 = (Vector<float,_3> *)(local_1a8 + 0x10);
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        local_1a8._0_8_ = pVVar20;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_440,(char *)local_1a8._0_8_,local_1a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_440," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_4e0,(BuiltinPrecisionTests *)&local_248,
                   (FloatFormat *)
                   ((long)((pIVar24->in1).
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15),pVVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_440,(char *)local_4e0,(long)local_4d8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_440,"\n",1);
        if (local_4e0 != (undefined1  [8])&aStack_4d0) {
          operator_delete((void *)local_4e0,(ulong)(aStack_4d0._M_allocated_capacity + 1));
        }
        if ((Vector<float,_3> *)local_1a8._0_8_ != (Vector<float,_3> *)(local_1a8 + 0x10)) {
          operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_440,"\t",1);
        pVVar6 = (local_4f0->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
        local_1a8._0_8_ = local_1a8 + 0x10;
        pcVar5 = (pVVar6->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pcVar5,pcVar5 + (pVVar6->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_440,(char *)local_1a8._0_8_,local_1a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_440," = ",3);
        valueToString<float>
                  ((string *)local_4e0,&local_248,
                   (float *)((long)local_278.out0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar23));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_440,(char *)local_4e0,(long)local_4d8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_440,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_440,"\tExpected range: ",0x11);
        intervalToString<float>(&local_490,&local_248,&local_468);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_440,local_490._M_dataplus._M_p,local_490._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_440,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_490._M_dataplus._M_p != &local_490.field_2) {
          operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
        }
        if (local_4e0 != (undefined1  [8])&aStack_4d0) {
          operator_delete((void *)local_4e0,(ulong)(aStack_4d0._M_allocated_capacity + 1));
        }
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_440);
        std::ios_base::~ios_base(local_3d0);
        this = local_2c0;
      }
      uVar17 = local_450 + 1;
      lVar15 = lVar15 + 0xc;
      lVar23 = lVar23 + 4;
    } while (local_2b8 != uVar17);
    iVar9 = (int)local_470;
    if (iVar9 < 0x65) {
      if (iVar9 == 0) goto LAB_007c0b7a;
    }
    else {
      local_448 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_440);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_440,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&pVStack_440,iVar9 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_440," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_440);
      std::ios_base::~ios_base(local_3d0);
    }
    local_448 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_440);
    std::ostream::operator<<((ostringstream *)&pVStack_440,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_440,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_440);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_440," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_440);
  std::ios_base::~ios_base(local_3d0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_278.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}